

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O0

void __thiscall tchecker::syncprod::system_t::extract_asynchronous_edges(system_t *this)

{
  bool bVar1;
  edges_collection_const_iterator_t *peVar2;
  element_type *edge_00;
  shared_ptr<const_tchecker::system::edge_t> local_50;
  __shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *local_40;
  edge_const_shared_ptr_t *edge;
  edges_collection_const_iterator_t __end2;
  edges_collection_const_iterator_t __begin2;
  range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
  *__range2;
  system_t *this_local;
  
  ___begin2 = tchecker::system::edges_t::edges(&(this->super_system_t).super_edges_t);
  peVar2 = range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
           ::begin((range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
                    *)&__begin2);
  __end2.super_const_iterator._M_current = (const_iterator)(peVar2->super_const_iterator)._M_current
  ;
  peVar2 = range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
           ::end((range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
                  *)&__begin2);
  edge = (edge_const_shared_ptr_t *)(peVar2->super_const_iterator)._M_current;
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2.super_const_iterator,
                            (__normal_iterator<const_std::shared_ptr<tchecker::system::edge_t>_*,_std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>
                             *)&edge), bVar1) {
    tchecker::system::edges_collection_const_iterator_t::operator*
              ((edges_collection_const_iterator_t *)&local_50);
    local_40 = (__shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)&local_50;
    edge_00 = std::
              __shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_50);
    bVar1 = is_asynchronous(this,edge_00);
    if (bVar1) {
      add_asynchronous_edge(this,(edge_const_shared_ptr_t *)local_40);
    }
    std::shared_ptr<const_tchecker::system::edge_t>::~shared_ptr(&local_50);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<tchecker::system::edge_t>_*,_std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>
    ::operator++(&__end2.super_const_iterator);
  }
  return;
}

Assistant:

void system_t::extract_asynchronous_edges()
{
  for (tchecker::system::edge_const_shared_ptr_t const & edge : edges())
    if (is_asynchronous(*edge))
      add_asynchronous_edge(edge);
}